

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_xop.cpp
# Opt level: O3

void ncnn::im2col_sgemm_pack1to4_int8_sse_xop
               (Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Option *opt)

{
  uint uVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int *piVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  undefined1 *puVar11;
  uint _h;
  long lVar12;
  int iVar13;
  undefined1 (*pauVar14) [16];
  uint uVar15;
  ulong uVar16;
  ulong *puVar17;
  size_t _elemsize;
  undefined1 *puVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  undefined1 (*pauVar22) [16];
  int iVar23;
  long lVar24;
  long lVar25;
  int iVar26;
  long lVar27;
  long lVar28;
  undefined1 auVar29 [16];
  undefined1 auVar31 [16];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 local_98 [64];
  size_t local_58;
  ulong local_48;
  Mat *local_40;
  ulong local_38;
  undefined1 auVar30 [64];
  undefined1 auVar32 [64];
  
  uVar1 = bottom_im2col->w;
  iVar26 = bottom_im2col->h;
  uVar15 = bottom_im2col->c;
  lVar27 = (long)(int)uVar15;
  uVar2 = top_blob->c;
  local_58 = 0;
  local_98._0_8_ = (void *)0x0;
  local_98._8_4_ = 0;
  local_98._12_4_ = 0;
  local_98._16_8_ = 0;
  local_98._24_4_ = 0;
  local_98._32_8_ = (Allocator *)0x0;
  local_98._40_4_ = 0;
  local_98._44_4_ = 0;
  local_98._48_12_ = SUB1612((undefined1  [16])0x0,4);
  iVar13 = iVar26;
  uVar9 = uVar1;
  if (lVar27 < 4) {
    iVar23 = 1;
    _elemsize = 1;
    _h = uVar15;
    if (1 < (int)uVar1) {
      iVar13 = iVar26 * 2;
      uVar9 = (uVar1 & 1) + (uVar1 >> 1);
      iVar23 = 1;
    }
  }
  else if ((int)uVar1 < 2) {
    iVar23 = 4;
    _elemsize = 4;
    _h = (uVar15 & 3) + (uVar15 >> 2);
  }
  else {
    _elemsize = 4;
    iVar13 = iVar26 * 2;
    _h = (uVar15 & 3) + (uVar15 >> 2);
    uVar9 = (uVar1 & 1) + (uVar1 >> 1);
    iVar23 = 4;
  }
  local_40 = top_blob;
  Mat::create((Mat *)local_98,iVar13,_h,uVar9,_elemsize,iVar23,opt->workspace_allocator);
  uVar8 = (ulong)(int)uVar1;
  if (0 < (int)uVar1 >> 1) {
    local_48 = (ulong)(uint)((int)uVar1 >> 1);
    lVar28 = 1;
    uVar21 = 0;
    do {
      local_38 = uVar21;
      puVar18 = (undefined1 *)(local_58 * local_38 * local_98._16_8_ + local_98._0_8_);
      if ((int)uVar15 < 4) {
        uVar21 = 0;
      }
      else {
        lVar20 = 3;
        lVar24 = 1;
        lVar25 = 2;
        uVar16 = 0;
        do {
          if (0 < iVar26) {
            lVar12 = bottom_im2col->elemsize * bottom_im2col->cstep;
            lVar10 = (long)bottom_im2col->data + lVar28;
            iVar13 = iVar26;
            do {
              *puVar18 = *(undefined1 *)(lVar10 + -1 + lVar12 * uVar16);
              puVar18[1] = *(undefined1 *)(lVar10 + -1 + lVar12 * lVar24);
              puVar18[2] = *(undefined1 *)(lVar10 + -1 + lVar12 * lVar25);
              puVar18[3] = *(undefined1 *)(lVar10 + -1 + lVar12 * lVar20);
              puVar18[4] = *(undefined1 *)(lVar10 + lVar12 * uVar16);
              puVar18[5] = *(undefined1 *)(lVar10 + lVar12 * lVar24);
              puVar18[6] = *(undefined1 *)(lVar10 + lVar12 * lVar25);
              puVar18[7] = *(undefined1 *)(lVar10 + lVar12 * lVar20);
              puVar18 = puVar18 + 8;
              lVar10 = lVar10 + (ulong)uVar1;
              iVar13 = iVar13 + -1;
            } while (iVar13 != 0);
          }
          uVar21 = uVar16 + 4;
          lVar10 = uVar16 + 7;
          lVar20 = lVar20 + 4;
          lVar24 = lVar24 + 4;
          lVar25 = lVar25 + 4;
          uVar16 = uVar21;
        } while (lVar10 < lVar27);
      }
      if ((int)uVar21 < (int)uVar15) {
        uVar21 = uVar21 & 0xffffffff;
        do {
          if (0 < iVar26) {
            lVar20 = bottom_im2col->cstep * bottom_im2col->elemsize * uVar21;
            lVar24 = (long)bottom_im2col->data + lVar28;
            iVar13 = iVar26;
            do {
              *puVar18 = *(undefined1 *)(lVar24 + -1 + lVar20);
              puVar18[1] = *(undefined1 *)(lVar24 + lVar20);
              puVar18 = puVar18 + 2;
              lVar24 = lVar24 + (ulong)uVar1;
              iVar13 = iVar13 + -1;
            } while (iVar13 != 0);
          }
          uVar21 = uVar21 + 1;
        } while (uVar21 != uVar15);
      }
      lVar28 = lVar28 + 2;
      uVar21 = local_38 + 1;
    } while (local_38 + 1 != local_48);
  }
  uVar21 = uVar8 & 0xfffffffffffffffe;
  if ((uint)uVar21 != uVar1) {
    do {
      uVar9 = ((uint)(uVar21 >> 0x1f) & 1) + (int)uVar21;
      puVar18 = (undefined1 *)
                (local_98._16_8_ * local_58 *
                 (long)(int)(((int)uVar9 >> 1) + ((int)uVar21 - (uVar9 & 0xfffffffe))) +
                local_98._0_8_);
      if ((int)uVar15 < 4) {
        uVar16 = 0;
      }
      else {
        lVar28 = 1;
        lVar20 = 2;
        lVar24 = 3;
        uVar19 = 0;
        do {
          if (0 < iVar26) {
            lVar25 = bottom_im2col->elemsize * bottom_im2col->cstep;
            lVar10 = (long)bottom_im2col->data + uVar21;
            iVar13 = iVar26;
            do {
              *puVar18 = *(undefined1 *)(lVar10 + lVar25 * uVar19);
              puVar18[1] = *(undefined1 *)(lVar10 + lVar25 * lVar28);
              puVar18[2] = *(undefined1 *)(lVar10 + lVar25 * lVar20);
              puVar18[3] = *(undefined1 *)(lVar10 + lVar25 * lVar24);
              puVar18 = puVar18 + 4;
              lVar10 = lVar10 + uVar8;
              iVar13 = iVar13 + -1;
            } while (iVar13 != 0);
          }
          uVar16 = uVar19 + 4;
          lVar25 = uVar19 + 7;
          lVar28 = lVar28 + 4;
          lVar20 = lVar20 + 4;
          lVar24 = lVar24 + 4;
          uVar19 = uVar16;
        } while (lVar25 < lVar27);
      }
      if ((int)uVar16 < (int)uVar15) {
        uVar16 = uVar16 & 0xffffffff;
        do {
          if (0 < iVar26) {
            puVar11 = (undefined1 *)
                      ((long)bottom_im2col->data +
                      uVar21 + bottom_im2col->cstep * uVar16 * bottom_im2col->elemsize);
            iVar13 = iVar26;
            do {
              *puVar18 = *puVar11;
              puVar18 = puVar18 + 1;
              puVar11 = puVar11 + uVar8;
              iVar13 = iVar13 + -1;
            } while (iVar13 != 0);
          }
          uVar16 = uVar16 + 1;
        } while (uVar16 != uVar15);
      }
      uVar21 = uVar21 + 1;
    } while ((long)uVar21 < (long)uVar8);
  }
  if (0 < (int)uVar2) {
    uVar9 = uVar15 + 3;
    if (-1 < (int)uVar15) {
      uVar9 = uVar15;
    }
    iVar13 = ((int)uVar9 >> 2) * iVar26;
    iVar26 = ((int)uVar15 % 4) * iVar26;
    uVar21 = 0;
    do {
      pauVar14 = (undefined1 (*) [16])
                 (local_40->cstep * uVar21 * local_40->elemsize + (long)local_40->data);
      if ((int)uVar1 < 2) {
        uVar16 = 0;
      }
      else {
        uVar19 = 0;
        do {
          puVar17 = (ulong *)((uVar19 >> 1) * local_58 * local_98._16_8_ + local_98._0_8_);
          pauVar22 = (undefined1 (*) [16])
                     (kernel->cstep * uVar21 * kernel->elemsize + (long)kernel->data);
          auVar30 = ZEXT1664((undefined1  [16])0x0);
          auVar29 = (undefined1  [16])0x0;
          if (0 < iVar13) {
            auVar29._8_8_ = 0;
            auVar29._0_8_ = *puVar17;
            auVar3 = vpmovsxbw_avx(auVar29);
            auVar29 = *pauVar22;
            auVar31 = vpcmpgtb_avx((undefined1  [16])0x0,auVar29);
            vpunpcklbw_avx(auVar29,auVar31);
            vpunpckhbw_avx(auVar29,auVar31);
            vpshufd_avx(auVar3,0x44);
            halt_baddata();
          }
          auVar32 = ZEXT1664((undefined1  [16])0x0);
          auVar31 = (undefined1  [16])0x0;
          if (0 < iVar26) {
            lVar27 = 0;
            do {
              auVar29 = vpmovsxbw_avx(ZEXT216(*(ushort *)((long)puVar17 + lVar27 * 2)));
              auVar29 = vpshuflw_avx(auVar29,0x50);
              auVar4 = vpshufd_avx(auVar29,0x50);
              auVar31._8_8_ = 0;
              auVar31._0_8_ = *(ulong *)(*pauVar22 + lVar27 * 4);
              auVar29 = vpmovsxbw_avx(auVar31);
              auVar29 = vpshufd_avx(auVar29,0x44);
              auVar3 = vpmullw_avx(auVar4,auVar29);
              auVar29 = vpmulhw_avx(auVar4,auVar29);
              auVar31 = vpunpcklwd_avx(auVar3,auVar29);
              auVar31 = vpaddd_avx(auVar32._0_16_,auVar31);
              auVar32 = ZEXT1664(auVar31);
              auVar29 = vpunpckhwd_avx(auVar3,auVar29);
              auVar29 = vpaddd_avx(auVar30._0_16_,auVar29);
              auVar30 = ZEXT1664(auVar29);
              lVar27 = lVar27 + 1;
            } while (iVar26 != (int)lVar27);
          }
          *pauVar14 = auVar31;
          pauVar14[1] = auVar29;
          pauVar14 = pauVar14 + 2;
          uVar16 = uVar19 + 2;
          lVar27 = uVar19 + 3;
          uVar19 = uVar16;
        } while (lVar27 < (long)uVar8);
      }
      if ((int)uVar16 < (int)uVar1) {
        do {
          puVar17 = (ulong *)((((uint)uVar16 & 1) + ((uint)(uVar16 >> 1) & 0x7fffffff)) * local_58 *
                              local_98._16_8_ + local_98._0_8_);
          pauVar22 = (undefined1 (*) [16])
                     (kernel->cstep * uVar21 * kernel->elemsize + (long)kernel->data);
          auVar30 = ZEXT1664((undefined1  [16])0x0);
          if (0 < iVar13) {
            auVar32 = ZEXT1664((undefined1  [16])0x0);
            auVar33 = ZEXT1664((undefined1  [16])0x0);
            auVar34 = ZEXT1664((undefined1  [16])0x0);
            iVar23 = iVar13;
            do {
              auVar3._8_8_ = 0;
              auVar3._0_8_ = *puVar17;
              auVar3 = vpmovsxbw_avx(auVar3);
              auVar29 = *pauVar22;
              auVar31 = vpcmpgtb_avx((undefined1  [16])0x0,auVar29);
              auVar5 = vpunpcklbw_avx(auVar29,auVar31);
              auVar4 = vpunpckhbw_avx(auVar29,auVar31);
              auVar29 = vpshufd_avx(auVar3,0x44);
              auVar3 = vpmullw_avx(auVar5,auVar29);
              auVar31 = vpmulhw_avx(auVar5,auVar29);
              auVar5 = vpmullw_avx(auVar29,auVar4);
              auVar4 = vpmulhw_avx(auVar29,auVar4);
              auVar29 = vpunpcklwd_avx(auVar3,auVar31);
              auVar29 = vpaddd_avx(auVar34._0_16_,auVar29);
              auVar34 = ZEXT1664(auVar29);
              auVar31 = vpunpckhwd_avx(auVar3,auVar31);
              auVar31 = vpaddd_avx(auVar33._0_16_,auVar31);
              auVar33 = ZEXT1664(auVar31);
              auVar3 = vpunpcklwd_avx(auVar5,auVar4);
              auVar3 = vpaddd_avx(auVar32._0_16_,auVar3);
              auVar32 = ZEXT1664(auVar3);
              auVar4 = vpunpckhwd_avx(auVar5,auVar4);
              auVar4 = vpaddd_avx(auVar30._0_16_,auVar4);
              auVar30 = ZEXT1664(auVar4);
              puVar17 = (ulong *)((long)puVar17 + 4);
              pauVar22 = pauVar22 + 1;
              iVar23 = iVar23 + -1;
            } while (iVar23 != 0);
            auVar5 = vpunpckldq_avx(auVar29,auVar31);
            auVar6 = vpunpckldq_avx(auVar3,auVar4);
            auVar31 = vpunpckhdq_avx(auVar29,auVar31);
            auVar3 = vpunpckhdq_avx(auVar3,auVar4);
            auVar4 = vpunpcklqdq_avx(auVar5,auVar6);
            auVar29 = vpunpckhqdq_avx(auVar5,auVar6);
            auVar29 = vpaddd_avx(auVar4,auVar29);
            auVar4 = vpunpcklqdq_avx(auVar31,auVar3);
            auVar31 = vpunpckhqdq_avx(auVar31,auVar3);
            auVar31 = vpaddd_avx(auVar31,auVar4);
            auVar29 = vpaddd_avx(auVar29,auVar31);
            auVar30 = ZEXT1664(auVar29);
          }
          auVar29 = auVar30._0_16_;
          if (0 < iVar26) {
            lVar27 = 0;
            do {
              auVar29 = vpshuflw_avx(ZEXT416((uint)(int)*(char *)((long)puVar17 + lVar27)),0);
              auVar3 = vpshufd_avx(auVar29,0);
              auVar4._8_8_ = 0;
              auVar4._0_8_ = *(ulong *)(*pauVar22 + lVar27 * 4);
              auVar29 = vpmovsxbw_avx(auVar4);
              auVar31 = vpmullw_avx(auVar3,auVar29);
              auVar29 = vpmulhw_avx(auVar3,auVar29);
              auVar29 = vpunpcklwd_avx(auVar31,auVar29);
              auVar29 = vpaddd_avx(auVar30._0_16_,auVar29);
              auVar30 = ZEXT1664(auVar29);
              lVar27 = lVar27 + 1;
            } while (iVar26 != (int)lVar27);
          }
          *pauVar14 = auVar29;
          pauVar14 = pauVar14 + 1;
          uVar15 = (uint)uVar16 + 1;
          uVar16 = (ulong)uVar15;
        } while (uVar15 != uVar1);
      }
      uVar21 = uVar21 + 1;
    } while (uVar21 != uVar2);
  }
  piVar7 = (int *)CONCAT44(local_98._12_4_,local_98._8_4_);
  if (piVar7 != (int *)0x0) {
    LOCK();
    *piVar7 = *piVar7 + -1;
    UNLOCK();
    if (*piVar7 == 0) {
      if ((Allocator *)local_98._32_8_ == (Allocator *)0x0) {
        if ((void *)local_98._0_8_ != (void *)0x0) {
          free((void *)local_98._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_98._32_8_)[3])();
      }
    }
  }
  return;
}

Assistant:

void im2col_sgemm_pack1to4_int8_sse_xop(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Option& opt)
{
    im2col_sgemm_pack1to4_int8_sse(bottom_im2col, top_blob, kernel, opt);
}